

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O3

boolean jtransform_request_workspace(j_decompress_ptr srcinfo,jpeg_transform_info *info)

{
  jpeg_error_mgr *pjVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  j_decompress_ptr pjVar5;
  jvirt_barray_ptr *ppjVar6;
  jvirt_barray_ptr pjVar7;
  ulong uVar8;
  int iVar9;
  jpeg_component_info *pjVar10;
  uint uVar11;
  jpeg_component_info *pjVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  JXFORM_CODE JVar16;
  uint uVar17;
  JDIMENSION JVar18;
  long lVar19;
  JDIMENSION *pJVar20;
  long lVar21;
  JDIMENSION *pJVar22;
  bool bVar23;
  
  if (((info->force_grayscale == 0) || (srcinfo->jpeg_color_space != JCS_YCbCr)) ||
     (srcinfo->num_components != 3)) {
    iVar9 = srcinfo->num_components;
    info->num_components = iVar9;
    bVar23 = iVar9 == 1;
    uVar4 = srcinfo->image_width;
    uVar17 = srcinfo->image_height;
    srcinfo->output_width = uVar4;
    srcinfo->output_height = uVar17;
    if (info->perfect == 0) goto LAB_0013c7ff;
    if (iVar9 == 1) goto LAB_0013c7bb;
    JVar16 = info->transform;
    bVar23 = false;
    if (JVar16 < JXFORM_WIPE) {
      uVar2 = srcinfo->max_v_samp_factor * srcinfo->min_DCT_scaled_size;
      if ((0x24U >> (JVar16 & 0x1f) & 1) == 0) {
        uVar3 = srcinfo->min_DCT_scaled_size * srcinfo->max_h_samp_factor;
        if ((0x50U >> (JVar16 & 0x1f) & 1) == 0) {
          bVar23 = false;
          if ((0x82U >> (JVar16 & 0x1f) & 1) == 0) goto LAB_0013c8a8;
          uVar3 = uVar4 % uVar3;
        }
        else {
          uVar3 = uVar17 % uVar2 | uVar4 % uVar3;
        }
      }
      else {
        uVar3 = uVar17 % uVar2;
      }
      if (uVar3 != 0) {
        return 0;
      }
      bVar23 = false;
    }
  }
  else {
    info->num_components = 1;
    uVar4 = srcinfo->image_width;
    uVar17 = srcinfo->image_height;
    srcinfo->output_width = uVar4;
    srcinfo->output_height = uVar17;
    if (info->perfect == 0) {
      bVar23 = true;
LAB_0013c7ff:
      JVar16 = info->transform;
    }
    else {
LAB_0013c7bb:
      JVar16 = info->transform;
      bVar23 = true;
      if (JXFORM_ROT_270 < JVar16) goto LAB_0013c8a8;
      uVar2 = srcinfo->min_DCT_scaled_size;
      uVar3 = uVar17;
      if ((0x24U >> (JVar16 & 0x1f) & 1) == 0) {
        if ((0x50U >> (JVar16 & 0x1f) & 1) == 0) {
          uVar3 = uVar4;
          if ((0x82U >> (JVar16 & 0x1f) & 1) == 0) goto LAB_0013c8a8;
          goto LAB_0013c870;
        }
        uVar3 = uVar17 % uVar2 | uVar4 % uVar2;
      }
      else {
LAB_0013c870:
        uVar3 = uVar3 % uVar2;
      }
      if (uVar3 != 0) {
        return 0;
      }
    }
  }
LAB_0013c8a8:
  pJVar22 = &srcinfo->output_width;
  pJVar20 = &srcinfo->output_height;
  if ((JVar16 < JXFORM_WIPE) && ((0xb8U >> (JVar16 & 0x1f) & 1) != 0)) {
    info->output_width = uVar17;
    info->output_height = uVar4;
    uVar4 = uVar17;
    if (bVar23) {
      uVar2 = srcinfo->min_DCT_scaled_size;
      info->iMCU_sample_width = uVar2;
      uVar17 = uVar2;
    }
    else {
      iVar9 = srcinfo->min_DCT_scaled_size;
      uVar17 = srcinfo->max_v_samp_factor * iVar9;
      info->iMCU_sample_width = uVar17;
      uVar2 = iVar9 * srcinfo->max_h_samp_factor;
    }
  }
  else {
    info->output_width = uVar4;
    info->output_height = uVar17;
    if (bVar23) {
      uVar2 = srcinfo->min_DCT_scaled_size;
      info->iMCU_sample_width = uVar2;
      uVar17 = uVar2;
    }
    else {
      iVar9 = srcinfo->min_DCT_scaled_size;
      uVar17 = srcinfo->max_h_samp_factor * iVar9;
      info->iMCU_sample_width = uVar17;
      uVar2 = iVar9 * srcinfo->max_v_samp_factor;
    }
  }
  info->iMCU_sample_height = uVar2;
  if (info->crop == 0) {
    info->x_crop_offset = 0;
    info->y_crop_offset = 0;
    JVar18 = 0;
    uVar4 = 0;
  }
  else {
    if (info->crop_xoffset_set == JCROP_UNSET) {
      info->crop_xoffset = 0;
    }
    if (info->crop_yoffset_set == JCROP_UNSET) {
      info->crop_yoffset = 0;
    }
    if (info->crop_width_set == JCROP_UNSET) {
      uVar17 = info->crop_xoffset;
      if (uVar4 <= uVar17) {
        pjVar1 = srcinfo->err;
        pjVar1->msg_code = 0x7c;
        (*pjVar1->error_exit)((j_common_ptr)srcinfo);
        uVar17 = info->crop_xoffset;
        uVar4 = info->output_width;
      }
      info->crop_width = uVar4 - uVar17;
    }
    else {
      uVar17 = info->crop_width;
      if (uVar4 < uVar17) {
        if (((JVar16 != JXFORM_NONE) || (uVar17 <= info->crop_xoffset)) ||
           (uVar17 - uVar4 < info->crop_xoffset)) {
LAB_0013c9c5:
          pjVar1 = srcinfo->err;
          pjVar1->msg_code = 0x7c;
          (*pjVar1->error_exit)((j_common_ptr)srcinfo);
        }
      }
      else if (((uVar4 - uVar17 < info->crop_xoffset) || (uVar17 == 0)) ||
              (uVar4 <= info->crop_xoffset)) goto LAB_0013c9c5;
    }
    uVar4 = info->output_height;
    if (info->crop_height_set == JCROP_UNSET) {
      uVar17 = info->crop_yoffset;
      if (uVar4 <= uVar17) {
        pjVar1 = srcinfo->err;
        pjVar1->msg_code = 0x7c;
        (*pjVar1->error_exit)((j_common_ptr)srcinfo);
        uVar17 = info->crop_yoffset;
        uVar4 = info->output_height;
      }
      info->crop_height = uVar4 - uVar17;
    }
    else {
      uVar17 = info->crop_height;
      if (uVar4 < uVar17) {
        if ((info->transform != JXFORM_NONE) ||
           (uVar17 <= info->crop_yoffset || uVar17 - uVar4 < info->crop_yoffset)) {
LAB_0013ca3e:
          pjVar1 = srcinfo->err;
          pjVar1->msg_code = 0x7c;
          (*pjVar1->error_exit)((j_common_ptr)srcinfo);
        }
      }
      else if (((uVar4 - uVar17 < info->crop_yoffset) || (uVar17 == 0)) ||
              (uVar4 <= info->crop_yoffset)) goto LAB_0013ca3e;
    }
    if (info->crop_xoffset_set == JCROP_NEG) {
      uVar4 = info->crop_width;
      uVar17 = info->output_width;
      if (uVar17 < uVar4) {
        uVar8 = (ulong)(uVar4 - (uVar17 + info->crop_xoffset));
      }
      else {
        uVar8 = (ulong)(uVar17 - (uVar4 + info->crop_xoffset));
      }
    }
    else {
      uVar8 = (ulong)info->crop_xoffset;
    }
    if (info->crop_yoffset_set == JCROP_NEG) {
      uVar4 = info->crop_height;
      uVar17 = info->output_height;
      if (uVar17 < uVar4) {
        JVar18 = uVar4 - (uVar17 + info->crop_yoffset);
      }
      else {
        JVar18 = uVar17 - (uVar4 + info->crop_yoffset);
      }
    }
    else {
      JVar18 = info->crop_yoffset;
    }
    uVar4 = JVar18;
    if (info->transform == JXFORM_WIPE) {
      lVar19 = jdiv_round_up((ulong)((int)(uVar8 % (ulong)(uint)info->iMCU_sample_width) +
                                    info->crop_width),(long)info->iMCU_sample_width);
      info->drop_width = (JDIMENSION)lVar19;
      lVar19 = jdiv_round_up((ulong)(JVar18 % (uint)info->iMCU_sample_height + info->crop_height),
                             (long)info->iMCU_sample_height);
      info->drop_height = (JDIMENSION)lVar19;
    }
    else if (info->transform == JXFORM_DROP) {
      uVar4 = info->crop_width;
      uVar17 = info->iMCU_sample_width;
      iVar9 = (int)uVar8;
      uVar3 = 0;
      uVar11 = ((iVar9 + uVar17) - 1) % uVar17;
      uVar15 = ~uVar11 + uVar17;
      uVar2 = uVar4 - uVar15;
      if (uVar4 < uVar15 || uVar2 == 0) {
        info->drop_width = 0;
      }
      else {
        if (uVar4 + iVar9 == info->output_width) {
          uVar2 = uVar11 + uVar4;
        }
        uVar3 = uVar2 / uVar17;
        info->drop_width = uVar3;
      }
      uVar8 = (ulong)(iVar9 + uVar15);
      uVar17 = info->crop_height;
      uVar2 = info->iMCU_sample_height;
      uVar11 = ((JVar18 + uVar2) - 1) % uVar2;
      uVar15 = ~uVar11 + uVar2;
      uVar4 = uVar15 + JVar18;
      if (uVar15 < uVar17) {
        uVar15 = -uVar15;
        if (JVar18 + uVar17 == info->output_height) {
          uVar15 = uVar11;
        }
        info->drop_height = (uVar15 + uVar17) / uVar2;
        if (((uVar3 != 0) && (uVar2 <= uVar15 + uVar17)) && (0 < info->num_components)) {
          lVar19 = 0;
          lVar21 = 0;
          do {
            pjVar5 = info->drop_ptr;
            if (pjVar5->num_components <= lVar21) break;
            pjVar10 = pjVar5->comp_info;
            pjVar12 = srcinfo->comp_info;
            if (srcinfo->max_h_samp_factor * *(int *)((long)&pjVar10->h_samp_factor + lVar19) !=
                pjVar5->max_h_samp_factor * *(int *)((long)&pjVar12->h_samp_factor + lVar19)) {
              pjVar1 = srcinfo->err;
              pjVar1->msg_code = 0x80;
              (pjVar1->msg_parm).i[0] = (int)lVar21;
              (srcinfo->err->msg_parm).i[1] =
                   *(int *)((long)&info->drop_ptr->comp_info->h_samp_factor + lVar19);
              (srcinfo->err->msg_parm).i[2] = info->drop_ptr->max_h_samp_factor;
              (srcinfo->err->msg_parm).i[3] =
                   *(int *)((long)&srcinfo->comp_info->h_samp_factor + lVar19);
              (srcinfo->err->msg_parm).i[4] = srcinfo->max_h_samp_factor;
              (srcinfo->err->msg_parm).i[5] = 0x68;
              (*srcinfo->err->error_exit)((j_common_ptr)srcinfo);
              pjVar5 = info->drop_ptr;
              pjVar10 = pjVar5->comp_info;
              pjVar12 = srcinfo->comp_info;
            }
            if (srcinfo->max_v_samp_factor * *(int *)((long)&pjVar10->v_samp_factor + lVar19) !=
                pjVar5->max_v_samp_factor * *(int *)((long)&pjVar12->v_samp_factor + lVar19)) {
              pjVar1 = srcinfo->err;
              pjVar1->msg_code = 0x80;
              (pjVar1->msg_parm).i[0] = (int)lVar21;
              (srcinfo->err->msg_parm).i[1] =
                   *(int *)((long)&info->drop_ptr->comp_info->v_samp_factor + lVar19);
              (srcinfo->err->msg_parm).i[2] = info->drop_ptr->max_v_samp_factor;
              (srcinfo->err->msg_parm).i[3] =
                   *(int *)((long)&srcinfo->comp_info->v_samp_factor + lVar19);
              (srcinfo->err->msg_parm).i[4] = srcinfo->max_v_samp_factor;
              (srcinfo->err->msg_parm).i[5] = 0x76;
              (*srcinfo->err->error_exit)((j_common_ptr)srcinfo);
            }
            lVar21 = lVar21 + 1;
            lVar19 = lVar19 + 0x60;
          } while (lVar21 < info->num_components);
        }
      }
      else {
        info->drop_height = 0;
      }
    }
    else {
      uVar17 = info->crop_width;
      if ((info->crop_width_set == JCROP_FORCE) || (info->output_width < uVar17)) {
        info->output_width = uVar17;
      }
      else {
        info->output_width = (int)(uVar8 % (ulong)(uint)info->iMCU_sample_width) + uVar17;
      }
      uVar17 = info->crop_height;
      if ((info->crop_height_set == JCROP_FORCE) || (info->output_height < uVar17)) {
        info->output_height = uVar17;
      }
      else {
        info->output_height = JVar18 % (uint)info->iMCU_sample_height + uVar17;
      }
    }
    JVar16 = info->transform;
    uVar17 = info->iMCU_sample_width;
    JVar18 = (JDIMENSION)(uVar8 / uVar17);
    info->x_crop_offset = JVar18;
    uVar2 = info->iMCU_sample_height;
    uVar4 = uVar4 / uVar2;
    info->y_crop_offset = uVar4;
  }
  ppjVar6 = (jvirt_barray_ptr *)0x0;
  switch(JVar16) {
  case JXFORM_NONE:
    bVar23 = true;
    if ((JVar18 == 0 && uVar4 == 0) &&
       ((info->output_width <= *pJVar22 && (info->output_height <= *pJVar20)))) {
LAB_0013ce88:
      ppjVar6 = (jvirt_barray_ptr *)0x0;
      goto switchD_0013cd85_default;
    }
    break;
  case JXFORM_FLIP_H:
    if (((info->trim != 0) && (uVar2 = info->output_width / uVar17, uVar17 <= info->output_width))
       && (JVar18 + uVar2 == *pJVar22 / uVar17)) {
      info->output_width = uVar2 * uVar17;
    }
    bVar23 = true;
    if ((uVar4 == 0) && (info->slow_hflip == 0)) goto LAB_0013ce88;
    break;
  case JXFORM_FLIP_V:
    bVar23 = true;
    if (info->trim != 0) {
LAB_0013cfd2:
      bVar23 = true;
      uVar17 = info->output_height / uVar2;
      if ((uVar2 <= info->output_height) && (uVar4 + uVar17 == *pJVar20 / uVar2)) {
        info->output_height = uVar17 * uVar2;
      }
    }
    break;
  case JXFORM_TRANSPOSE:
    goto switchD_0013cd85_caseD_3;
  case JXFORM_TRANSVERSE:
    if (info->trim != 0) {
      uVar3 = info->output_width / uVar17;
      if ((uVar17 <= info->output_width) && (JVar18 + uVar3 == *pJVar20 / uVar17)) {
        info->output_width = uVar3 * uVar17;
      }
LAB_0013ce07:
      bVar23 = false;
      uVar17 = info->output_height / uVar2;
      if ((info->output_height < uVar2) || (bVar23 = false, uVar4 + uVar17 != *pJVar22 / uVar2))
      break;
      info->output_height = uVar17 * uVar2;
    }
    goto switchD_0013cd85_caseD_3;
  case JXFORM_ROT_90:
    if (info->trim != 0) {
      bVar23 = false;
      uVar4 = info->output_width / uVar17;
      if ((info->output_width < uVar17) || (bVar23 = false, JVar18 + uVar4 != *pJVar20 / uVar17))
      break;
      info->output_width = uVar4 * uVar17;
    }
    goto switchD_0013cd85_caseD_3;
  case JXFORM_ROT_180:
    bVar23 = true;
    if (info->trim != 0) {
      uVar3 = info->output_width / uVar17;
      if ((uVar17 <= info->output_width) && (JVar18 + uVar3 == *pJVar22 / uVar17)) {
        info->output_width = uVar3 * uVar17;
      }
      goto LAB_0013cfd2;
    }
    break;
  case JXFORM_ROT_270:
    if (info->trim != 0) goto LAB_0013ce07;
switchD_0013cd85_caseD_3:
    bVar23 = false;
    break;
  default:
    goto switchD_0013cd85_default;
  }
  ppjVar6 = (jvirt_barray_ptr *)
            (*srcinfo->mem->alloc_small)((j_common_ptr)srcinfo,1,(long)info->num_components << 3);
  lVar19 = jdiv_round_up((ulong)info->output_width,(long)info->iMCU_sample_width);
  lVar21 = jdiv_round_up((ulong)info->output_height,(long)info->iMCU_sample_height);
  uVar8 = (ulong)(uint)info->num_components;
  if (0 < info->num_components) {
    lVar14 = 0xc;
    lVar13 = 0;
    do {
      iVar9 = 1;
      JVar18 = 1;
      if ((int)uVar8 != 1) {
        pjVar10 = srcinfo->comp_info;
        if (bVar23) {
          iVar9 = *(int *)((long)pjVar10 + lVar14 + -4);
          JVar18 = *(JDIMENSION *)((long)&pjVar10->component_id + lVar14);
        }
        else {
          JVar18 = *(JDIMENSION *)((long)pjVar10 + lVar14 + -4);
          iVar9 = *(int *)((long)&pjVar10->component_id + lVar14);
        }
      }
      pjVar7 = (*srcinfo->mem->request_virt_barray)
                         ((j_common_ptr)srcinfo,1,0,iVar9 * (int)lVar19,JVar18 * (int)lVar21,JVar18)
      ;
      ppjVar6[lVar13] = pjVar7;
      lVar13 = lVar13 + 1;
      uVar8 = (ulong)info->num_components;
      lVar14 = lVar14 + 0x60;
    } while (lVar13 < (long)uVar8);
  }
switchD_0013cd85_default:
  info->workspace_coef_arrays = ppjVar6;
  return 1;
}

Assistant:

GLOBAL(boolean)
jtransform_request_workspace(j_decompress_ptr srcinfo,
                             jpeg_transform_info *info)
{
  jvirt_barray_ptr *coef_arrays;
  boolean need_workspace, transpose_it;
  jpeg_component_info *compptr;
  JDIMENSION xoffset, yoffset, dtemp;
  JDIMENSION width_in_iMCUs, height_in_iMCUs;
  JDIMENSION width_in_blocks, height_in_blocks;
  int itemp, ci, h_samp_factor, v_samp_factor;

  /* Determine number of components in output image */
  if (info->force_grayscale &&
      srcinfo->jpeg_color_space == JCS_YCbCr &&
      srcinfo->num_components == 3)
    /* We'll only process the first component */
    info->num_components = 1;
  else
    /* Process all the components */
    info->num_components = srcinfo->num_components;

  /* Compute output image dimensions and related values. */
#if JPEG_LIB_VERSION >= 80
  jpeg_core_output_dimensions(srcinfo);
#else
  srcinfo->output_width = srcinfo->image_width;
  srcinfo->output_height = srcinfo->image_height;
#endif

  /* Return right away if -perfect is given and transformation is not perfect.
   */
  if (info->perfect) {
    if (info->num_components == 1) {
      if (!jtransform_perfect_transform(srcinfo->output_width,
          srcinfo->output_height,
          srcinfo->_min_DCT_h_scaled_size,
          srcinfo->_min_DCT_v_scaled_size,
          info->transform))
        return FALSE;
    } else {
      if (!jtransform_perfect_transform(srcinfo->output_width,
          srcinfo->output_height,
          srcinfo->max_h_samp_factor * srcinfo->_min_DCT_h_scaled_size,
          srcinfo->max_v_samp_factor * srcinfo->_min_DCT_v_scaled_size,
          info->transform))
        return FALSE;
    }
  }

  /* If there is only one output component, force the iMCU size to be 1;
   * else use the source iMCU size.  (This allows us to do the right thing
   * when reducing color to grayscale, and also provides a handy way of
   * cleaning up "funny" grayscale images whose sampling factors are not 1x1.)
   */
  switch (info->transform) {
  case JXFORM_TRANSPOSE:
  case JXFORM_TRANSVERSE:
  case JXFORM_ROT_90:
  case JXFORM_ROT_270:
    info->output_width = srcinfo->output_height;
    info->output_height = srcinfo->output_width;
    if (info->num_components == 1) {
      info->iMCU_sample_width = srcinfo->_min_DCT_v_scaled_size;
      info->iMCU_sample_height = srcinfo->_min_DCT_h_scaled_size;
    } else {
      info->iMCU_sample_width =
        srcinfo->max_v_samp_factor * srcinfo->_min_DCT_v_scaled_size;
      info->iMCU_sample_height =
        srcinfo->max_h_samp_factor * srcinfo->_min_DCT_h_scaled_size;
    }
    break;
  default:
    info->output_width = srcinfo->output_width;
    info->output_height = srcinfo->output_height;
    if (info->num_components == 1) {
      info->iMCU_sample_width = srcinfo->_min_DCT_h_scaled_size;
      info->iMCU_sample_height = srcinfo->_min_DCT_v_scaled_size;
    } else {
      info->iMCU_sample_width =
        srcinfo->max_h_samp_factor * srcinfo->_min_DCT_h_scaled_size;
      info->iMCU_sample_height =
        srcinfo->max_v_samp_factor * srcinfo->_min_DCT_v_scaled_size;
    }
    break;
  }

  /* If cropping has been requested, compute the crop area's position and
   * dimensions, ensuring that its upper left corner falls at an iMCU boundary.
   */
  if (info->crop) {
    /* Insert default values for unset crop parameters */
    if (info->crop_xoffset_set == JCROP_UNSET)
      info->crop_xoffset = 0;   /* default to +0 */
    if (info->crop_yoffset_set == JCROP_UNSET)
      info->crop_yoffset = 0;   /* default to +0 */
    if (info->crop_width_set == JCROP_UNSET) {
      if (info->crop_xoffset >= info->output_width)
        ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      info->crop_width = info->output_width - info->crop_xoffset;
    } else {
      /* Check for crop extension */
      if (info->crop_width > info->output_width) {
        /* Crop extension does not work when transforming! */
        if (info->transform != JXFORM_NONE ||
            info->crop_xoffset >= info->crop_width ||
            info->crop_xoffset > info->crop_width - info->output_width)
          ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      } else {
        if (info->crop_xoffset >= info->output_width ||
            info->crop_width <= 0 ||
            info->crop_xoffset > info->output_width - info->crop_width)
          ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      }
    }
    if (info->crop_height_set == JCROP_UNSET) {
      if (info->crop_yoffset >= info->output_height)
        ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      info->crop_height = info->output_height - info->crop_yoffset;
    } else {
      /* Check for crop extension */
      if (info->crop_height > info->output_height) {
        /* Crop extension does not work when transforming! */
        if (info->transform != JXFORM_NONE ||
            info->crop_yoffset >= info->crop_height ||
            info->crop_yoffset > info->crop_height - info->output_height)
          ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      } else {
        if (info->crop_yoffset >= info->output_height ||
            info->crop_height <= 0 ||
            info->crop_yoffset > info->output_height - info->crop_height)
          ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      }
    }
    /* Convert negative crop offsets into regular offsets */
    if (info->crop_xoffset_set != JCROP_NEG)
      xoffset = info->crop_xoffset;
    else if (info->crop_width > info->output_width) /* crop extension */
      xoffset = info->crop_width - info->output_width - info->crop_xoffset;
    else
      xoffset = info->output_width - info->crop_width - info->crop_xoffset;
    if (info->crop_yoffset_set != JCROP_NEG)
      yoffset = info->crop_yoffset;
    else if (info->crop_height > info->output_height) /* crop extension */
      yoffset = info->crop_height - info->output_height - info->crop_yoffset;
    else
      yoffset = info->output_height - info->crop_height - info->crop_yoffset;
    /* Now adjust so that upper left corner falls at an iMCU boundary */
    switch (info->transform) {
    case JXFORM_DROP:
      /* Ensure the effective drop region will not exceed the requested */
      itemp = info->iMCU_sample_width;
      dtemp = itemp - 1 - ((xoffset + itemp - 1) % itemp);
      xoffset += dtemp;
      if (info->crop_width <= dtemp)
        info->drop_width = 0;
      else if (xoffset + info->crop_width - dtemp == info->output_width)
        /* Matching right edge: include partial iMCU */
        info->drop_width = (info->crop_width - dtemp + itemp - 1) / itemp;
      else
        info->drop_width = (info->crop_width - dtemp) / itemp;
      itemp = info->iMCU_sample_height;
      dtemp = itemp - 1 - ((yoffset + itemp - 1) % itemp);
      yoffset += dtemp;
      if (info->crop_height <= dtemp)
        info->drop_height = 0;
      else if (yoffset + info->crop_height - dtemp == info->output_height)
        /* Matching bottom edge: include partial iMCU */
        info->drop_height = (info->crop_height - dtemp + itemp - 1) / itemp;
      else
        info->drop_height = (info->crop_height - dtemp) / itemp;
      /* Check if sampling factors match for dropping */
      if (info->drop_width != 0 && info->drop_height != 0)
        for (ci = 0; ci < info->num_components &&
                     ci < info->drop_ptr->num_components; ci++) {
          if (info->drop_ptr->comp_info[ci].h_samp_factor *
              srcinfo->max_h_samp_factor !=
              srcinfo->comp_info[ci].h_samp_factor *
              info->drop_ptr->max_h_samp_factor)
            ERREXIT6(srcinfo, JERR_BAD_DROP_SAMPLING, ci,
              info->drop_ptr->comp_info[ci].h_samp_factor,
              info->drop_ptr->max_h_samp_factor,
              srcinfo->comp_info[ci].h_samp_factor,
              srcinfo->max_h_samp_factor, 'h');
          if (info->drop_ptr->comp_info[ci].v_samp_factor *
              srcinfo->max_v_samp_factor !=
              srcinfo->comp_info[ci].v_samp_factor *
              info->drop_ptr->max_v_samp_factor)
            ERREXIT6(srcinfo, JERR_BAD_DROP_SAMPLING, ci,
              info->drop_ptr->comp_info[ci].v_samp_factor,
              info->drop_ptr->max_v_samp_factor,
              srcinfo->comp_info[ci].v_samp_factor,
              srcinfo->max_v_samp_factor, 'v');
        }
      break;
    case JXFORM_WIPE:
      /* Ensure the effective wipe region will cover the requested */
      info->drop_width = (JDIMENSION)jdiv_round_up
        ((long)(info->crop_width + (xoffset % info->iMCU_sample_width)),
         (long)info->iMCU_sample_width);
      info->drop_height = (JDIMENSION)jdiv_round_up
        ((long)(info->crop_height + (yoffset % info->iMCU_sample_height)),
         (long)info->iMCU_sample_height);
      break;
    default:
      /* Ensure the effective crop region will cover the requested */
      if (info->crop_width_set == JCROP_FORCE ||
          info->crop_width > info->output_width)
        info->output_width = info->crop_width;
      else
        info->output_width =
          info->crop_width + (xoffset % info->iMCU_sample_width);
      if (info->crop_height_set == JCROP_FORCE ||
          info->crop_height > info->output_height)
        info->output_height = info->crop_height;
      else
        info->output_height =
          info->crop_height + (yoffset % info->iMCU_sample_height);
    }
    /* Save x/y offsets measured in iMCUs */
    info->x_crop_offset = xoffset / info->iMCU_sample_width;
    info->y_crop_offset = yoffset / info->iMCU_sample_height;
  } else {
    info->x_crop_offset = 0;
    info->y_crop_offset = 0;
  }

  /* Figure out whether we need workspace arrays,
   * and if so whether they are transposed relative to the source.
   */
  need_workspace = FALSE;
  transpose_it = FALSE;
  switch (info->transform) {
  case JXFORM_NONE:
    if (info->x_crop_offset != 0 || info->y_crop_offset != 0 ||
        info->output_width > srcinfo->output_width ||
        info->output_height > srcinfo->output_height)
      need_workspace = TRUE;
    /* No workspace needed if neither cropping nor transforming */
    break;
  case JXFORM_FLIP_H:
    if (info->trim)
      trim_right_edge(info, srcinfo->output_width);
    if (info->y_crop_offset != 0 || info->slow_hflip)
      need_workspace = TRUE;
    /* do_flip_h_no_crop doesn't need a workspace array */
    break;
  case JXFORM_FLIP_V:
    if (info->trim)
      trim_bottom_edge(info, srcinfo->output_height);
    /* Need workspace arrays having same dimensions as source image. */
    need_workspace = TRUE;
    break;
  case JXFORM_TRANSPOSE:
    /* transpose does NOT have to trim anything */
    /* Need workspace arrays having transposed dimensions. */
    need_workspace = TRUE;
    transpose_it = TRUE;
    break;
  case JXFORM_TRANSVERSE:
    if (info->trim) {
      trim_right_edge(info, srcinfo->output_height);
      trim_bottom_edge(info, srcinfo->output_width);
    }
    /* Need workspace arrays having transposed dimensions. */
    need_workspace = TRUE;
    transpose_it = TRUE;
    break;
  case JXFORM_ROT_90:
    if (info->trim)
      trim_right_edge(info, srcinfo->output_height);
    /* Need workspace arrays having transposed dimensions. */
    need_workspace = TRUE;
    transpose_it = TRUE;
    break;
  case JXFORM_ROT_180:
    if (info->trim) {
      trim_right_edge(info, srcinfo->output_width);
      trim_bottom_edge(info, srcinfo->output_height);
    }
    /* Need workspace arrays having same dimensions as source image. */
    need_workspace = TRUE;
    break;
  case JXFORM_ROT_270:
    if (info->trim)
      trim_bottom_edge(info, srcinfo->output_width);
    /* Need workspace arrays having transposed dimensions. */
    need_workspace = TRUE;
    transpose_it = TRUE;
    break;
  case JXFORM_WIPE:
    break;
  case JXFORM_DROP:
    break;
  }

  /* Allocate workspace if needed.
   * Note that we allocate arrays padded out to the next iMCU boundary,
   * so that transform routines need not worry about missing edge blocks.
   */
  if (need_workspace) {
    coef_arrays = (jvirt_barray_ptr *)
      (*srcinfo->mem->alloc_small) ((j_common_ptr)srcinfo, JPOOL_IMAGE,
                sizeof(jvirt_barray_ptr) * info->num_components);
    width_in_iMCUs = (JDIMENSION)
      jdiv_round_up((long)info->output_width, (long)info->iMCU_sample_width);
    height_in_iMCUs = (JDIMENSION)
      jdiv_round_up((long)info->output_height, (long)info->iMCU_sample_height);
    for (ci = 0; ci < info->num_components; ci++) {
      compptr = srcinfo->comp_info + ci;
      if (info->num_components == 1) {
        /* we're going to force samp factors to 1x1 in this case */
        h_samp_factor = v_samp_factor = 1;
      } else if (transpose_it) {
        h_samp_factor = compptr->v_samp_factor;
        v_samp_factor = compptr->h_samp_factor;
      } else {
        h_samp_factor = compptr->h_samp_factor;
        v_samp_factor = compptr->v_samp_factor;
      }
      width_in_blocks = width_in_iMCUs * h_samp_factor;
      height_in_blocks = height_in_iMCUs * v_samp_factor;
      coef_arrays[ci] = (*srcinfo->mem->request_virt_barray)
        ((j_common_ptr)srcinfo, JPOOL_IMAGE, FALSE,
         width_in_blocks, height_in_blocks, (JDIMENSION)v_samp_factor);
    }
    info->workspace_coef_arrays = coef_arrays;
  } else
    info->workspace_coef_arrays = NULL;

  return TRUE;
}